

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseUint32(JSONParser *this,uint32_t *out_int)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint32_t last_result;
  int c;
  uint32_t result;
  uint32_t *out_int_local;
  JSONParser *this_local;
  
  last_result = 0;
  SkipWhitespace(this);
  while ((iVar1 = ReadChar(this), 0x2f < iVar1 && (iVar1 < 0x3a))) {
    uVar2 = last_result * 10 + iVar1 + -0x30;
    bVar3 = uVar2 < last_result;
    last_result = uVar2;
    if (bVar3) {
      PrintError(this,"uint32 overflow");
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  PutbackChar(this);
  *out_int = last_result;
  wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseUint32(uint32_t* out_int) {
  uint32_t result = 0;
  SkipWhitespace();
  while (1) {
    int c = ReadChar();
    if (c >= '0' && c <= '9') {
      uint32_t last_result = result;
      result = result * 10 + static_cast<uint32_t>(c - '0');
      if (result < last_result) {
        PrintError("uint32 overflow");
        return wabt::Result::Error;
      }
    } else {
      PutbackChar();
      break;
    }
  }
  *out_int = result;
  return wabt::Result::Ok;
}